

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_16ac71::SymlinkCommand::configureAttribute
          (SymlinkCommand *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  int iVar1;
  char *LHS;
  int *__s1;
  size_t sVar2;
  string *this_00;
  undefined1 auVar3 [16];
  StringRef value_local;
  StringRef name_local;
  string local_70;
  Twine local_50;
  Twine local_38;
  
  sVar2 = value.Length;
  __s1 = (int *)value.Data;
  name_local.Length = name.Length;
  name_local.Data = name.Data;
  value_local.Data = (char *)__s1;
  value_local.Length = sVar2;
  if (name_local.Length == 0x1d) {
    iVar1 = bcmp(name_local.Data,"repair-via-ownership-analysis",0x1d);
    if (iVar1 == 0) {
      if (sVar2 == 5) {
        iVar1 = bcmp(__s1,"false",5);
        if (iVar1 == 0) {
          (this->super_Command).repairViaOwnershipAnalysis = false;
          return true;
        }
      }
      else if ((sVar2 == 4) && (*__s1 == 0x65757274)) {
        (this->super_Command).repairViaOwnershipAnalysis = true;
        return true;
      }
      LHS = "invalid value for attribute: \'";
      goto LAB_00136f05;
    }
  }
  else if (name_local.Length == 0x10) {
    auVar3[0] = -((char)*(long *)name_local.Data == 'l');
    auVar3[1] = -(*(char *)((long)name_local.Data + 1) == 'i');
    auVar3[2] = -(*(char *)((long)name_local.Data + 2) == 'n');
    auVar3[3] = -(*(char *)((long)name_local.Data + 3) == 'k');
    auVar3[4] = -(*(char *)((long)name_local.Data + 4) == '-');
    auVar3[5] = -(*(char *)((long)name_local.Data + 5) == 'o');
    auVar3[6] = -(*(char *)((long)name_local.Data + 6) == 'u');
    auVar3[7] = -(*(char *)((long)name_local.Data + 7) == 't');
    auVar3[8] = -((char)*(long *)((long)name_local.Data + 8) == 'p');
    auVar3[9] = -(*(char *)((long)name_local.Data + 9) == 'u');
    auVar3[10] = -(*(char *)((long)name_local.Data + 10) == 't');
    auVar3[0xb] = -(*(char *)((long)name_local.Data + 0xb) == '-');
    auVar3[0xc] = -(*(char *)((long)name_local.Data + 0xc) == 'p');
    auVar3[0xd] = -(*(char *)((long)name_local.Data + 0xd) == 'a');
    auVar3[0xe] = -(*(char *)((long)name_local.Data + 0xe) == 't');
    auVar3[0xf] = -(*(char *)((long)name_local.Data + 0xf) == 'h');
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe | (ushort)(auVar3[0xf] >> 7) << 0xf)
        == 0xffff) {
      llvm::StringRef::str_abi_cxx11_(&local_70,&value_local);
      this_00 = (string *)&this->linkOutputPath;
      goto LAB_00136ec8;
    }
  }
  else if ((name_local.Length == 8) && (*(long *)name_local.Data == 0x73746e65746e6f63)) {
    llvm::StringRef::str_abi_cxx11_(&local_70,&value_local);
    this_00 = (string *)&this->contents;
LAB_00136ec8:
    std::__cxx11::string::operator=(this_00,(string *)&local_70);
    std::__cxx11::string::_M_dispose();
    return true;
  }
  LHS = "unexpected attribute: \'";
LAB_00136f05:
  llvm::Twine::Twine(&local_38,LHS,&name_local);
  llvm::Twine::Twine(&local_50,"\'");
  llvm::Twine::concat((Twine *)&local_70,&local_38,&local_50);
  llbuild::buildsystem::ConfigureContext::error(ctx,(Twine *)&local_70);
  return false;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "contents") {
      contents = value;
      return true;
    } else if (name == "link-output-path") {
      linkOutputPath = value;
      return true;
    } else if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if (value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        ctx.error("invalid value for attribute: '" + name + "'");
        return false;
      }
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
  }